

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void CPP::generateMultiDirectiveBegin(QTextStream *outputStream,QSet<QString> *directives)

{
  Data *pDVar1;
  Span *pSVar2;
  iterator iVar3;
  iterator iVar4;
  QTextStream *pQVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  long in_FS_OFFSET;
  qtConfig local_58;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (directives->q_hash).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    if (pDVar1->size == 1) {
      pSVar2 = pDVar1->spans;
      if (pSVar2->offsets[0] == 0xff) {
        uVar7 = 1;
        do {
          uVar6 = uVar7;
          uVar7 = uVar6 + 1;
        } while (pSVar2[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
      }
      else {
        uVar6 = 0;
      }
      local_48.ptr = *(QString **)
                      (pSVar2[uVar6 >> 7].entries[pSVar2[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].
                       storage.data + 8);
      local_48.d = *(Data **)(pSVar2[uVar6 >> 7].entries
                              [pSVar2[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.data + 0x10);
      language::operator<<(outputStream,(openQtConfig *)&local_48);
    }
    else {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QSet<QString>::values((QList<QString> *)&local_48,directives);
      iVar3 = QList<QString>::begin((QList<QString> *)&local_48);
      iVar4 = QList<QString>::end((QList<QString> *)&local_48);
      if (iVar3.i != iVar4.i) {
        uVar7 = ((long)iVar4.i - (long)iVar3.i >> 3) * -0x5555555555555555;
        lVar9 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::__introsort_loop<QList<QString>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar3.i,iVar4.i,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (iVar3.i,iVar4.i);
      }
      pQVar5 = (QTextStream *)QTextStream::operator<<(outputStream,"#if ");
      local_58.super_StringViewStreamable.m_parameter.m_data = ((local_48.ptr)->d).ptr;
      local_58.super_StringViewStreamable.m_parameter.m_size = ((local_48.ptr)->d).size;
      language::operator<<(pQVar5,&local_58);
      if ((undefined1 *)0x1 < (ulong)local_48.size) {
        puVar8 = (undefined1 *)(local_48.size + -1);
        lVar9 = 0x28;
        do {
          pQVar5 = (QTextStream *)QTextStream::operator<<(outputStream," || ");
          local_58.super_StringViewStreamable.m_parameter.m_data =
               *(storage_type_conflict **)((long)local_48.ptr + lVar9 + -8);
          local_58.super_StringViewStreamable.m_parameter.m_size =
               *(qsizetype *)((long)&((local_48.ptr)->d).d + lVar9);
          language::operator<<(pQVar5,&local_58);
          lVar9 = lVar9 + 0x18;
          puVar8 = puVar8 + -1;
        } while (puVar8 != (undefined1 *)0x0);
      }
      Qt::endl(outputStream);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void generateMultiDirectiveBegin(QTextStream &outputStream, const QSet<QString> &directives)
{
    if (directives.isEmpty())
        return;

    if (directives.size() == 1) {
        outputStream << language::openQtConfig(*directives.cbegin());
        return;
    }

    auto list = directives.values();
    // sort (always generate in the same order):
    std::sort(list.begin(), list.end());

    outputStream << "#if " << language::qtConfig(list.constFirst());
    for (qsizetype i = 1, size = list.size(); i < size; ++i)
        outputStream << " || " << language::qtConfig(list.at(i));
    outputStream << Qt::endl;
}